

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O3

void __thiscall
asmjit::ZoneTree<asmjit::AddressTableEntry>::insert<asmjit::Support::Compare<0u>>
          (ZoneTree<asmjit::AddressTableEntry> *this,AddressTableEntry *node,Compare<0U> *cmp)

{
  uint *puVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  AddressTableEntry *pAVar6;
  ulong extraout_RAX;
  AddressTableEntry *pAVar7;
  AddressTableEntry *pAVar8;
  AddressTableEntry *pAVar9;
  byte *extraout_RDX;
  char *extraout_RDX_00;
  OffsetFormat *format;
  uint uVar10;
  int iVar11;
  AddressTableEntry *pAVar12;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  long lVar16;
  uintptr_t uVar17;
  ulong uVar18;
  ulong *puVar19;
  ZoneTreeNode *save;
  byte *pbVar20;
  bool bVar21;
  bool bVar22;
  ulong uStack_70;
  uintptr_t local_40;
  AddressTableEntry *local_38;
  
  uVar14 = (node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[0];
  if (uVar14 < 2) {
    if ((node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[1] ==
        0) {
      if (uVar14 == 0) {
        pAVar8 = this->_root;
        if (pAVar8 == (AddressTableEntry *)0x0) {
          this->_root = node;
        }
        else {
          pAVar6 = (AddressTableEntry *)&local_40;
          local_40 = 0;
          local_38 = pAVar8;
          (node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[0] =
               1;
          pAVar9 = (AddressTableEntry *)0x0;
          pAVar12 = (AddressTableEntry *)0x0;
          uVar14 = 0;
          uVar18 = 0;
          while( true ) {
            uVar13 = uVar14;
            if (pAVar8 == (AddressTableEntry *)0x0) {
              (pAVar12->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
              _rbNodeData[uVar13] =
                   (ulong)((uint)(pAVar12->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                 super_ZoneTreeNode._rbNodeData[uVar13] & 1) | (ulong)node;
              pAVar7 = node;
            }
            else {
              uVar14 = (pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                       _rbNodeData[0];
              pbVar15 = (byte *)(uVar14 & 0xfffffffffffffffe);
              pAVar7 = pAVar8;
              if ((((pbVar15 != (byte *)0x0) && ((*pbVar15 & 1) != 0)) &&
                  (pbVar20 = (byte *)(pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                     super_ZoneTreeNode._rbNodeData[1], pbVar20 != (byte *)0x0)) &&
                 ((*pbVar20 & 1) != 0)) {
                (pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                _rbNodeData[0] = uVar14 | 1;
                *pbVar15 = *pbVar15 & 0xfe;
                puVar19 = (ulong *)(pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                   super_ZoneTreeNode._rbNodeData[1];
                *puVar19 = *puVar19 & 0xfffffffffffffffe;
              }
            }
            if (((pAVar12 != (AddressTableEntry *)0x0) &&
                (((pAVar7->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                  _rbNodeData[0] & 1) != 0)) &&
               (((pAVar12->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                 _rbNodeData[0] & 1) != 0)) {
              bVar21 = pAVar9 == (AddressTableEntry *)
                                 (pAVar6->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                 super_ZoneTreeNode._rbNodeData[1];
              bVar22 = uVar18 == 0;
              bVar5 = !bVar22;
              uVar14 = (pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                       _rbNodeData[bVar5];
              pbVar15 = (byte *)(uVar14 & 0xfffffffffffffffe);
              pbVar20 = (byte *)(*(ulong *)(pbVar15 + (ulong)bVar22 * 8) & 0xfffffffffffffffe);
              if (pAVar7 == (AddressTableEntry *)
                            ((pAVar12->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                             super_ZoneTreeNode._rbNodeData[uVar18] & 0xfffffffffffffffe)) {
                puVar19 = (ulong *)(pbVar15 + (ulong)bVar22 * 8);
                uVar17 = (ulong)pbVar20 | (ulong)((uint)uVar14 & 1);
              }
              else {
                uVar18 = (ulong)((uint)bVar5 * 8);
                lVar16 = (ulong)bVar22 * 8;
                *(ulong *)(pbVar15 + lVar16) =
                     (ulong)((uint)*(ulong *)(pbVar15 + (ulong)bVar22 * 8) & 1) |
                     *(ulong *)(pbVar20 + uVar18) & 0xfffffffffffffffe;
                *(ulong *)(pbVar20 + uVar18) =
                     (ulong)((uint)*(undefined8 *)(pbVar20 + uVar18) & 1) | (ulong)pbVar15;
                *pbVar15 = *pbVar15 | 1;
                *pbVar20 = *pbVar20 & 0xfe;
                uVar14 = (ulong)((uint)*(undefined8 *)
                                        ((long)(pAVar9->
                                               super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                               super_ZoneTreeNode._rbNodeData + uVar18) & 1);
                *(ulong *)((long)(pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                 super_ZoneTreeNode._rbNodeData + uVar18) = uVar14 | (ulong)pbVar20;
                puVar19 = (ulong *)(pbVar20 + lVar16);
                uVar17 = *(ulong *)(pbVar20 + lVar16) & 0xfffffffffffffffe | uVar14;
                pbVar15 = pbVar20;
              }
              (pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
              _rbNodeData[bVar5] = uVar17;
              *puVar19 = (ulong)((uint)*puVar19 & 1) | (ulong)pAVar9;
              *(byte *)(pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                       _rbNodeData =
                   (byte)(pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode
                         ._rbNodeData[0] | 1;
              *pbVar15 = *pbVar15 & 0xfe;
              (pAVar6->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
              _rbNodeData[bVar21] =
                   (ulong)((uint)(pAVar6->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                 super_ZoneTreeNode._rbNodeData[bVar21] & 1) | (ulong)pbVar15;
            }
            if (pAVar7 == node) break;
            uVar14 = (ulong)(pAVar7->_address < node->_address);
            if (pAVar9 != (AddressTableEntry *)0x0) {
              pAVar6 = pAVar9;
            }
            pAVar8 = (AddressTableEntry *)
                     ((pAVar7->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                      _rbNodeData[uVar14] & 0xfffffffffffffffe);
            pAVar9 = pAVar12;
            pAVar12 = pAVar7;
            uVar18 = uVar13;
          }
          this->_root = local_38;
          *(byte *)(local_38->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                   _rbNodeData =
               (byte)(local_38->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                     _rbNodeData[0] & 0xfe;
        }
        return;
      }
      goto LAB_00114f67;
    }
  }
  else {
    insert<asmjit::Support::Compare<0u>>();
  }
  insert<asmjit::Support::Compare<0u>>();
LAB_00114f67:
  insert<asmjit::Support::Compare<0u>>();
  bVar3 = extraout_RDX[5];
  if ((bVar3 == 0) || ((uint)extraout_RDX[3] * 8 < (uint)bVar3)) {
    return;
  }
  bVar4 = extraout_RDX[7];
  if (bVar4 != 0) {
    if (0x20 < bVar4) {
      CodeWriterUtils::encodeOffset32();
      bVar3 = extraout_RDX_00[5];
      if ((bVar3 != 0) && ((uint)bVar3 <= (uint)(byte)extraout_RDX_00[3] << 3)) {
        bVar4 = extraout_RDX_00[7];
        if (bVar4 != 0) {
          if (0x20 < bVar4) {
            CodeWriterUtils::encodeOffset64();
            if (format->_valueSize - 1 < 8) {
              uVar14 = (ulong)format->_valueOffset;
              uStack_70 = extraout_RAX;
              switch((uint)format->_valueSize) {
              case 1:
                bVar5 = CodeWriterUtils::encodeOffset32((uint32_t *)&uStack_70,(int64_t)node,format)
                ;
                if (bVar5) {
                  pbVar15 = (byte *)((long)&this->_root + uVar14);
                  *pbVar15 = *pbVar15 | (byte)uStack_70;
                }
                break;
              case 2:
                bVar5 = CodeWriterUtils::encodeOffset32((uint32_t *)&uStack_70,(int64_t)node,format)
                ;
                if (bVar5) {
                  puVar2 = (ushort *)((long)&this->_root + uVar14);
                  *puVar2 = *puVar2 | (ushort)uStack_70;
                }
                break;
              case 4:
                bVar5 = CodeWriterUtils::encodeOffset32((uint32_t *)&uStack_70,(int64_t)node,format)
                ;
                if (bVar5) {
                  puVar1 = (uint *)((long)&this->_root + uVar14);
                  *puVar1 = *puVar1 | (uint)uStack_70;
                }
                break;
              case 8:
                bVar5 = CodeWriterUtils::encodeOffset64(&uStack_70,(int64_t)node,format);
                if (bVar5) {
                  puVar19 = (ulong *)((long)&this->_root + uVar14);
                  *puVar19 = *puVar19 | uStack_70;
                }
              }
            }
            return;
          }
          if (((~(uint)(-1L << (bVar4 & 0x3f)) | 1) & (uint)node) != 0) {
            return;
          }
          node = (AddressTableEntry *)((long)node >> (bVar4 & 0x3f));
        }
        if (((AddressTableEntry *)(((long)node << (-bVar3 & 0x3f)) >> (-bVar3 & 0x3f)) == node) &&
           (*extraout_RDX_00 == '\0')) {
          this->_root = (AddressTableEntry *)
                        (((ulong)((long)node << (-bVar3 & 0x3f)) >> (-bVar3 & 0x3f)) <<
                        (extraout_RDX_00[6] & 0x3fU));
          return;
        }
      }
      return;
    }
    if (((~(uint)(-1L << (bVar4 & 0x3f)) | 1) & (uint)node) != 0) {
      return;
    }
    node = (AddressTableEntry *)((long)node >> (bVar4 & 0x3f));
  }
  uVar10 = (uint)node;
  if ((AddressTableEntry *)(long)(int)uVar10 != node) {
    return;
  }
  if ((int)(uVar10 << (-bVar3 & 0x1f)) >> (-bVar3 & 0x1f) == uVar10) {
    if (*extraout_RDX - 1 < 2) {
      if (extraout_RDX[6] != 5) {
        return;
      }
      if (bVar3 != 0x15) {
        return;
      }
      if (extraout_RDX[3] != 4) {
        return;
      }
      iVar11 = (uVar10 & 3) * 0x20000000 + (uVar10 & 0x1ffffc) * 8;
    }
    else {
      if (*extraout_RDX != 0) {
        return;
      }
      iVar11 = (uVar10 & ~(uint)(-1L << (bVar3 & 0x3f))) << (extraout_RDX[6] & 0x1f);
    }
    *(int *)&this->_root = iVar11;
    return;
  }
  return;
}

Assistant:

inline bool hasLeft() const noexcept { return _rbNodeData[0] > kRedMask; }